

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poc-http.c
# Opt level: O2

int poc_mainloop(http_server_t *server,char *filename,int quiet)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  unsigned_long uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char *__format;
  long lVar8;
  ulong uVar9;
  timeval tv;
  ulong local_5ec8;
  file_t mp3_file;
  mp3_frame_t frame;
  
  iVar4 = file_open_read(&mp3_file,filename);
  if (iVar4 == 0) {
    __format = "Could not open mp3 file: %s\n";
  }
  else {
    if (quiet == 0) {
      fprintf(_stderr,"\rStreaming %s...\n",filename);
    }
    local_5ec8 = 0;
    while( true ) {
      iVar4 = mp3_next_frame(&mp3_file,&frame);
      if ((iVar4 < 0) || ((finished & 1) != 0)) break;
      gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
      _Var2 = tv.tv_usec;
      _Var1 = tv.tv_sec;
      iVar4 = http_server_main(server,(void *)0x0);
      if (iVar4 == 0) {
        fwrite("Http main error\n",0x10,1,_stderr);
        return 0;
      }
      lVar8 = 0;
      for (uVar9 = 0; uVar3 = frame.usec, uVar9 < server->num_clients; uVar9 = uVar9 + 1) {
        iVar4 = *(int *)(server->clients->buf + lVar8 + -0x10);
        if (((iVar4 != -1) && (1 < *(int *)(server->clients->buf + lVar8 + -0xc))) &&
           (uVar5 = unix_write(iVar4,frame.raw,frame.frame_size),
           frame.frame_size != (long)(int)uVar5)) {
          fprintf(_stderr,"Error writing to client %d: %d\n",uVar9 & 0xffffffff,(ulong)uVar5);
          http_client_close(server,(http_client_t *)(server->clients->buf + lVar8 + -0x10));
        }
        lVar8 = lVar8 + 0x2018;
      }
      poc_mainloop::wait_time = poc_mainloop::wait_time + frame.usec;
      if (1000 < poc_mainloop::wait_time) {
        usleep((__useconds_t)poc_mainloop::wait_time);
      }
      local_5ec8 = local_5ec8 + uVar3;
      if (quiet == 0) {
        iVar4 = poc_mainloop::count + 1;
        iVar6 = poc_mainloop::count % 10;
        poc_mainloop::count = iVar4;
        if (iVar6 == 0) {
          uVar9 = (local_5ec8 / 1000000) % 0x3c;
          if (mp3_file.size == 0) {
            fprintf(_stderr,"\r%02ld:%02ld %ld %3ldkbit/s %4ldb ",local_5ec8 / 60000000,uVar9,
                    mp3_file.offset,frame.bitrate,frame.frame_size);
          }
          else {
            lVar8 = (long)(((float)(local_5ec8 / 1000) / ((float)mp3_file.offset + 1.0)) *
                          (float)mp3_file.size);
            fprintf(_stderr,"\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld (%3ld%%) %3ldkbit/s %4ldb ",
                    local_5ec8 / 60000000,uVar9,lVar8 / 60000,(lVar8 / 1000) % 0x3c,mp3_file.offset,
                    mp3_file.size,(long)(((float)mp3_file.offset * 100.0) / (float)mp3_file.size),
                    frame.bitrate,frame.frame_size);
          }
        }
        fflush(_stderr);
      }
      gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
      poc_mainloop::wait_time =
           (_Var2 - tv.tv_usec) + (tv.tv_sec - _Var1) * -1000000 + poc_mainloop::wait_time;
      uVar7 = (uint)poc_mainloop::wait_time;
      uVar5 = -uVar7;
      if (0 < (int)uVar7) {
        uVar5 = uVar7;
      }
      if (1000000 < uVar5) {
        poc_mainloop::wait_time = 0;
      }
    }
    iVar4 = file_close(&mp3_file);
    if (iVar4 != 0) {
      return 1;
    }
    __format = "Could not close mp3 file %s\n";
  }
  fprintf(_stderr,__format,filename);
  return 0;
}

Assistant:

int poc_mainloop(http_server_t *server, char *filename, int quiet) {
  /*M
    Open file for reading.
  **/
  file_t     mp3_file;
  if (!file_open_read(&mp3_file, filename)) {
    fprintf(stderr, "Could not open mp3 file: %s\n", filename);
    return 0;
  }

  if (!quiet)
    fprintf(stderr, "\rStreaming %s...\n", filename);
  
  static long wait_time = 0;
  unsigned long frame_time = 0;
  
  mp3_frame_t    frame;

  /*M
    Cycle through the frames and send them using HTTP.
  **/
  while ((mp3_next_frame(&mp3_file, &frame) >= 0) && !finished) {
    /*M
      Get start time for this frame iteration.
    **/
    struct timeval tv;
    gettimeofday(&tv, NULL);
    unsigned long start_sec, start_usec;
    start_sec = tv.tv_sec;
    start_usec = tv.tv_usec;
    
    /*M
      Go through HTTP main routine and check for timeouts,
      received data, etc...
    **/
    if (!http_server_main(server, NULL)) {
      fprintf(stderr, "Http main error\n");
      return 0;
    }
    
    /*M
      Write frame to HTTP clients.
    **/
    int i;
    for (i = 0; i < server->num_clients; i++) {
      if ((server->clients[i].fd != -1) &&
          (server->clients[i].found >= 2)) {
        int ret;
        
        ret = unix_write(server->clients[i].fd, frame.raw, frame.frame_size);
        
        if (ret != frame.frame_size) {
          fprintf(stderr, "Error writing to client %d: %d\n", i, ret);
          http_client_close(server, server->clients + i);
        }
      }
    }
    frame_time += frame.usec;
    wait_time += frame.usec;
    
    /*M
      Sleep for duration of frame.
    **/
    if (wait_time > 1000)
      usleep(wait_time);
    
    /*M
      Print information.
    **/
    if (!quiet) {
      static int count = 0;
      if ((count++) % 10 == 0) {
        if (mp3_file.size > 0) {
          fprintf(stderr, "\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld (%3ld%%) %3ldkbit/s %4ldb ",
                  (frame_time/1000000) / 60,
                  (frame_time/1000000) % 60,

                  (long)((float)(frame_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                  60000,
                  (long)((float)(frame_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                  1000 % 60,
                  mp3_file.offset,
                  mp3_file.size,
                  (long)(100*(float)mp3_file.offset/(float)mp3_file.size),
                  frame.bitrate,
                  frame.frame_size);
        } else {
          fprintf(stderr, "\r%02ld:%02ld %ld %3ldkbit/s %4ldb ",
                  (frame_time/1000000) / 60,
                  (frame_time/1000000) % 60,
                  mp3_file.offset,
                  frame.bitrate,
                  frame.frame_size);
        }
      }
      fflush(stderr);
    }

    /*M
      Get length of iteration.
    **/
    gettimeofday(&tv, NULL);
    unsigned long len =
      (tv.tv_sec - start_sec) * 1000000 + (tv.tv_usec - start_usec);

    wait_time -= len;
    if (abs((int)wait_time) > MAX_WAIT_TIME)
      wait_time = 0;
  }
  
  if (!file_close(&mp3_file)) {
    fprintf(stderr, "Could not close mp3 file %s\n", filename);
    return 0;
  }

  return 1;
}